

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulsummaryxreftocsv.cpp
# Opt level: O0

void gulsummaryxreftocsv::doit(void)

{
  size_t local_20;
  size_t i;
  uint local_10;
  gulsummaryxref q;
  
  printf("\"coverage_id\", \"summary_id\", \"summaryset_id\"\n");
  local_20 = fread((void *)((long)&i + 4),0xc,1,_stdin);
  while (local_20 != 0) {
    printf("%d, %d, %d\n",(ulong)i._4_4_,(ulong)local_10,(ulong)(uint)q.coverage_id);
    local_20 = fread((void *)((long)&i + 4),0xc,1,_stdin);
  }
  return;
}

Assistant:

void doit()
	{

		printf("\"coverage_id\", \"summary_id\", \"summaryset_id\"\n");

		gulsummaryxref q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %d, %d\n", q.coverage_id, q.summary_id, q.summaryset_id);
			i = fread(&q, sizeof(q), 1, stdin);
		}
	}